

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcBlast.c
# Opt level: O2

void Wlc_BlastRotateLeft(Gia_Man_t *pNew,int *pNum,int nNum,int *pShift,int nShift,Vec_Int_t *vRes)

{
  int iVar1;
  int *piVar2;
  int *pArray;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  
  piVar2 = Wlc_VecCopy(vRes,pNum,nNum);
  pArray = (int *)malloc((long)nNum << 2);
  if (0x20 < nShift) {
    __assert_fail("nShift <= 32",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcBlast.c"
                  ,0xcc,"void Wlc_BlastRotateLeft(Gia_Man_t *, int *, int, int *, int, Vec_Int_t *)"
                 );
  }
  uVar5 = 0;
  uVar3 = 0;
  if (0 < nNum) {
    uVar3 = (ulong)(uint)nNum;
  }
  uVar8 = (ulong)(uint)nShift;
  if (nShift < 1) {
    uVar8 = uVar5;
  }
  for (; uVar5 != uVar8; uVar5 = uVar5 + 1) {
    iVar6 = 1 << ((byte)uVar5 & 0x1f);
    iVar7 = iVar6;
    for (uVar4 = 0; uVar3 != uVar4; uVar4 = uVar4 + 1) {
      if ((long)uVar4 < (long)iVar6) {
        iVar1 = nNum - iVar7 % nNum;
      }
      else {
        iVar1 = (int)uVar4 - iVar6;
      }
      iVar1 = Gia_ManHashMux(pNew,pShift[uVar5],piVar2[iVar1 % nNum],piVar2[uVar4]);
      pArray[uVar4] = iVar1;
      iVar7 = iVar7 + -1;
    }
    piVar2 = Wlc_VecCopy(vRes,pArray,nNum);
  }
  free(pArray);
  return;
}

Assistant:

void Wlc_BlastRotateLeft( Gia_Man_t * pNew, int * pNum, int nNum, int * pShift, int nShift, Vec_Int_t * vRes )
{
    int * pRes = Wlc_VecCopy( vRes, pNum, nNum );
    int i, j, * pTemp = ABC_ALLOC( int, nNum );
    assert( nShift <= 32 );
    for( i = 0; i < nShift; i++, pRes = Wlc_VecCopy(vRes, pTemp, nNum) ) 
        for( j = 0; j < nNum; j++ ) 
        {
            int move = (j >= (1<<i)) ? (j-(1<<i))%nNum : (nNum - (((1<<i)-j)%nNum)) % nNum;
            pTemp[j] = Gia_ManHashMux( pNew, pShift[i], pRes[move], pRes[j] );
//            pTemp[j] = Gia_ManHashMux( pNew, pShift[i], pRes[((unsigned)(nNum-(1<<i)+j))%nNum], pRes[j] );
        }
    ABC_FREE( pTemp );
}